

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O2

int zReadValues(FILE *fp,int n,doublecomplex *destination,int perline,int persize)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char *__s;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  int local_d0;
  double local_a8;
  char buf [100];
  
  bVar2 = false;
  uVar7 = 0;
  if (0 < persize) {
    uVar7 = (ulong)(uint)persize;
  }
  lVar3 = (long)persize;
  local_d0 = 0;
  while (local_d0 < n) {
    __s = buf;
    fgets(__s,100,(FILE *)fp);
    lVar4 = 0;
    while ((lVar4 < perline && (local_d0 < n))) {
      lVar6 = (lVar4 + 1) * lVar3;
      cVar1 = buf[lVar6];
      buf[lVar6] = '\0';
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        if ((byte)(__s[uVar5] | 0x20U) == 100) {
          __s[uVar5] = 'E';
        }
      }
      if (bVar2) {
        lVar8 = (long)local_d0;
        destination[lVar8].r = local_a8;
        dVar9 = atof(buf + lVar4 * lVar3);
        local_d0 = local_d0 + 1;
        destination[lVar8].i = dVar9;
      }
      else {
        local_a8 = atof(buf + lVar4 * lVar3);
      }
      bVar2 = !bVar2;
      buf[lVar6] = cVar1;
      __s = __s + lVar3;
      lVar4 = lVar4 + 1;
    }
  }
  return 0;
}

Assistant:

int zReadValues(FILE *fp, int n, doublecomplex *destination, int perline, int persize)
{
    register int i, j, k, s, pair;
    register double realpart;
    char tmp, buf[100];
    
    i = pair = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    if ( pair == 0 ) {
	  	/* The value is real part */
		realpart = atof(&buf[s]);
		pair = 1;
	    } else {
		/* The value is imaginary part */
	        destination[i].r = realpart;
		destination[i++].i = atof(&buf[s]);
		pair = 0;
	    }
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}